

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DC16NoTop_SSE2(uint8_t *dst,uint8_t *left)

{
  uint8_t *unaff_retaddr;
  
  DC16NoLeft_SSE2(left,unaff_retaddr);
  return;
}

Assistant:

static void DC16NoTop_SSE2(uint8_t* dst) {  // DC with top samples unavailable
  int DC = 8;
  int j;
  for (j = 0; j < 16; ++j) {
    DC += dst[-1 + j * BPS];
  }
  Put16_SSE2(DC >> 4, dst);
}